

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall
kratos::Simulator::process_stmt(Simulator *this,SequentialStmtBlock *block,Var *var_)

{
  Var *var_00;
  bool bVar1;
  bool bVar2;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *this_00;
  reference pEVar3;
  unsigned_long *puVar4;
  optional<unsigned_long> oVar5;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_c0;
  type *local_a0;
  type *value;
  type *var;
  _Node_iterator_base<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_88;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *__range1_1;
  optional<unsigned_long> val_1;
  optional<unsigned_long> val;
  EventControl *event;
  const_iterator __end1;
  const_iterator __begin1;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *__range1;
  bool trigger;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *conditions;
  Var *var__local;
  SequentialStmtBlock *block_local;
  Simulator *this_local;
  
  this_00 = SequentialStmtBlock::get_event_controls(block);
  bVar2 = false;
  __end1 = std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::begin(this_00);
  event = (EventControl *)
          std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
                                *)&event);
    if (!bVar1) {
LAB_00370357:
      if (bVar2) {
        process_stmt(this,&block->super_StmtBlock,var_);
        __end1_1 = std::
                   unordered_map<kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::begin(&this->nba_values_);
        local_88._M_cur =
             (__node_type *)
             std::
             unordered_map<kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::end(&this->nba_values_);
        while (bVar2 = std::__detail::operator!=
                                 (&__end1_1.
                                   super__Node_iterator_base<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                                  ,&local_88), bVar2) {
          var = &std::__detail::
                 _Node_iterator<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
                 ::operator*(&__end1_1)->first;
          value = (type *)std::
                          get<0ul,kratos::Var*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                                    ((pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      *)var);
          local_a0 = std::
                     get<1ul,kratos::Var*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                               ((pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)var);
          var_00 = (Var *)(value->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                          ._M_impl.super__Vector_impl_data._M_start;
          std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
          optional<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                    (&local_c0,local_a0);
          set_complex_value_(this,var_00,&local_c0);
          std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional
                    (&local_c0);
          std::__detail::
          _Node_iterator<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
          ::operator++(&__end1_1);
        }
        std::
        unordered_map<kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::clear(&this->nba_values_);
      }
      return;
    }
    pEVar3 = __gnu_cxx::
             __normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
             ::operator*(&__end1);
    if (pEVar3->var == var_) {
      if (pEVar3->edge == Posedge) {
        oVar5 = get_value_(this,pEVar3->var);
        val_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._8_8_ =
             oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional *)
                           &val_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_long>._M_engaged);
        if ((bVar1) &&
           (puVar4 = std::optional<unsigned_long>::operator*
                               ((optional<unsigned_long> *)
                                &val_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_long>._M_engaged),
           *puVar4 != 0)) {
          bVar2 = true;
          goto LAB_00370357;
        }
      }
      else {
        oVar5 = get_value_(this,pEVar3->var);
        __range1_1 = oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._M_payload;
        val_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
             oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
        bVar1 = std::optional::operator_cast_to_bool((optional *)&__range1_1);
        if ((bVar1) &&
           (puVar4 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&__range1_1)
           , *puVar4 == 0)) {
          bVar2 = true;
          goto LAB_00370357;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void Simulator::process_stmt(kratos::SequentialStmtBlock *block, const Var *var_) {
    // only trigger it if it's actually high/low
    auto const &conditions = block->get_event_controls();
    bool trigger = false;
    for (auto const &event : conditions) {
        if (event.var != var_) continue;
        if (event.edge == EventEdgeType::Posedge) {
            auto val = get_value_(event.var);
            if (val && *val) {
                trigger = true;
                break;
            }
        } else {
            auto val = get_value_(event.var);
            if (val && (!(*val))) {
                trigger = true;
                break;
            }
        }
    }
    if (!trigger) return;
    process_stmt(reinterpret_cast<StmtBlock *>(block), var_);

    for (auto const &[var, value] : nba_values_) {
        set_complex_value_(var, value);
    }
    // clear the nba regions
    nba_values_.clear();
}